

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_200625d::BlendA64MaskTest8B_RandomValues_Test::TestBody
          (BlendA64MaskTest8B_RandomValues_Test *this)

{
  ACMRandom *this_00;
  bool bVar1;
  uint32_t uVar2;
  int bsize;
  int block_size;
  long lVar3;
  
  this_00 = &(this->super_BlendA64MaskTest8B).
             super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
             .
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int)>
             .rng_;
  block_size = 0;
  do {
    bVar1 = testing::Test::HasFatalFailure();
    if (bVar1) {
      return;
    }
    lVar3 = 0x3c048;
    do {
      uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      *(char *)((long)this + lVar3 + -0x3c010) = (char)(uVar2 >> 0x17);
      uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      *(char *)((long)this + lVar3 + -0x28010) = (char)(uVar2 >> 0x17);
      uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      *(char *)((long)this + lVar3 + -0x14008) = (char)(uVar2 >> 0x17);
      uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      (this->super_BlendA64MaskTest8B).
      super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
      .dst_ref_[lVar3 + -0x38] = (uchar)(uVar2 >> 0x17);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x50048);
    lVar3 = 0x50050;
    do {
      uVar2 = testing::internal::Random::Generate(&this_00->random_,0x41);
      (this->super_BlendA64MaskTest8B).
      super_BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
      .dst_ref_[lVar3 + -0x38] = (uchar)uVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x60050);
    BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
    ::RunTest((BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
               *)this,block_size,1);
    block_size = block_size + 1;
  } while (block_size != 0x16);
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B, RandomValues) {
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL && !HasFatalFailure(); ++bsize) {
    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_.Rand8();
      dst_tst_[i] = rng_.Rand8();

      src0_[i] = rng_.Rand8();
      src1_[i] = rng_.Rand8();
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

    RunTest(bsize, 1);
  }
}